

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O0

void __thiscall Centaurus::Stage1Runner::signal_exit(Stage1Runner *this)

{
  void *pvVar1;
  WindowBankState WVar2;
  int local_28;
  int i_1;
  WindowBankState state;
  int i;
  int count;
  WindowBankEntry *banks;
  Stage1Runner *this_local;
  
  pvVar1 = (this->super_BaseRunner).m_sub_window;
  do {
    state = Free;
    for (i_1 = 0; i_1 < (this->super_BaseRunner).m_bank_num; i_1 = i_1 + 1) {
      WVar2 = std::atomic<Centaurus::BaseRunner::WindowBankState>::load
                        ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                         ((long)pvVar1 + (long)i_1 * 8 + 4),memory_order_seq_cst);
      if (WVar2 != Free) {
        state = state + Stage1_Locked;
      }
    }
  } while (state != Free);
  for (local_28 = 0; local_28 < (this->super_BaseRunner).m_bank_num; local_28 = local_28 + 1) {
    std::atomic<Centaurus::BaseRunner::WindowBankState>::store
              ((atomic<Centaurus::BaseRunner::WindowBankState> *)
               ((long)pvVar1 + (long)local_28 * 8 + 4),YouAreDone,memory_order_seq_cst);
    BaseRunner::release_semaphore(&this->super_BaseRunner);
  }
  return;
}

Assistant:

void signal_exit()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      int count = 0;
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState state = banks[i].state.load();
        if (state != WindowBankState::Free)
          count++;
      }
      if (count == 0) break;
    }
    for (int i = 0; i < m_bank_num; i++) {
      banks[i].state.store(WindowBankState::YouAreDone);
      release_semaphore();
    }
  }